

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_offsetsurface.cpp
# Opt level: O2

bool __thiscall
ON_OffsetSurfaceFunction::SetOffsetPoint
          (ON_OffsetSurfaceFunction *this,double s,double t,double distance,double radius)

{
  double dVar1;
  bool bVar2;
  uint uVar3;
  double *pdVar4;
  ulong uVar5;
  int *piVar6;
  int iVar7;
  ulong uVar8;
  double dVar9;
  double local_68;
  double local_58;
  ON_OffsetSurfaceValue local_40;
  
  bVar2 = ON_IsValid(s);
  if (((!bVar2) || (bVar2 = ON_IsValid(t), !bVar2)) || (bVar2 = ON_IsValid(distance), !bVar2)) {
    return false;
  }
  bVar2 = ON_IsValid(radius);
  iVar7 = 0;
  if (!bVar2) {
    return false;
  }
  dVar9 = ON_Interval::NormalizedParameterAt((ON_Interval *)&this->field_0x8,s);
  dVar1 = 0.0;
  if (dVar9 < 1.490116119385e-08) {
LAB_0056e971:
    dVar9 = dVar1;
    pdVar4 = ON_Interval::operator[]((ON_Interval *)&this->field_0x8,iVar7);
    local_58 = *pdVar4;
  }
  else {
    local_58 = s;
    if (0.9999999850988388 < dVar9) {
      iVar7 = 1;
      dVar1 = 1.0;
      goto LAB_0056e971;
    }
  }
  local_68 = ON_Interval::NormalizedParameterAt((ON_Interval *)&this->field_0x18,t);
  if (1.490116119385e-08 <= local_68) {
    if (local_68 <= 0.9999999850988388) goto LAB_0056ea00;
    local_68 = 1.0;
    iVar7 = 1;
  }
  else {
    local_68 = 0.0;
    iVar7 = 0;
  }
  pdVar4 = ON_Interval::operator[]((ON_Interval *)&this->field_0x18,iVar7);
  t = *pdVar4;
LAB_0056ea00:
  if (1.0 < local_68) {
    return false;
  }
  if (dVar9 < 0.0) {
    return false;
  }
  if (1.0 < dVar9) {
    return false;
  }
  if (local_68 < 0.0) {
    return false;
  }
  local_40.m_s = local_58;
  if (radius <= 0.0) {
    radius = 0.0;
  }
  local_40.m_index = (int)((local_68 * 4096.0 + dVar9) * 4096.0);
  uVar3 = (this->m_offset_value).m_count;
  uVar5 = 0;
  uVar8 = 0;
  if (0 < (int)uVar3) {
    uVar8 = (ulong)uVar3;
  }
  piVar6 = &((this->m_offset_value).m_a)->m_index;
  do {
    if (uVar8 == uVar5) {
LAB_0056eac4:
      if ((uint)uVar8 == uVar3) {
        local_40.m_t = t;
        local_40.m_distance = distance;
        local_40.m_radius = radius;
        ON_SimpleArray<ON_OffsetSurfaceValue>::Append(&this->m_offset_value,&local_40);
        if (-1 < (this->m_bumps).m_capacity) {
          (this->m_bumps).m_count = 0;
        }
        this->m_bValid = false;
      }
      return true;
    }
    if (*piVar6 == local_40.m_index) {
      *piVar6 = local_40.m_index;
      *(double *)(piVar6 + -4) = distance;
      *(double *)(piVar6 + -2) = radius;
      ((ON_OffsetSurfaceValue *)(piVar6 + -8))->m_s = local_58;
      *(double *)(piVar6 + -6) = t;
      uVar3 = (this->m_offset_value).m_count;
      uVar8 = uVar5 & 0xffffffff;
      goto LAB_0056eac4;
    }
    uVar5 = uVar5 + 1;
    piVar6 = piVar6 + 10;
  } while( true );
}

Assistant:

bool ON_OffsetSurfaceFunction::SetOffsetPoint(
  double s,
  double t,
  double distance,
  double radius
  )
{
  bool rc = false;
  if ( ON_IsValid(s) && ON_IsValid(t) && ON_IsValid(distance) && ON_IsValid(radius) )
  {
    double u = m_domain[0].NormalizedParameterAt(s);

    // 14 Jan 2008, Mikko, TRR 29861:
    // Changing the clamping to happen when the 
    // point is outside or nearly outside the domain.
    const double dTol = ON_SQRT_EPSILON; // tiny border around untrimmed edges

    if ( u < dTol)
    {
      s = m_domain[0][0];
      u = 0.0;
    }
    if ( u > 1.0-dTol)
    {
      s = m_domain[0][1];
      u = 1.0;
    }

    double v = m_domain[1].NormalizedParameterAt(t);
    if ( v < dTol)
    {
      t = m_domain[1][0];
      v = 0.0;
    }
    if ( v > 1.0-dTol)
    {
      t = m_domain[1][1];
      v = 1.0;
    }

    if ( u >= 0.0 && u <= 1.0 && v >= 0.0 && v <= 1.0 )
    {
      ON_OffsetSurfaceValue offset_value;
      offset_value.m_s = s;
      offset_value.m_t = t;
      offset_value.m_distance = distance;
      offset_value.m_radius = (radius > 0.0) ? radius : 0.0;
      offset_value.m_index = (int)((u + v*4096.0)*4096.0);
      int i;
      for ( i = 0; i < m_offset_value.Count(); i++ )
      {
        if ( m_offset_value[i].m_index == offset_value.m_index )
        {
          m_offset_value[i] = offset_value;
          break;
        }
      }
      if (i == m_offset_value.Count())
      {
        m_offset_value.Append(offset_value);
        m_bumps.SetCount(0);
        m_bValid = false;
      }
      rc = true;
    }
  }
  return rc;
}